

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPlayTree.h
# Opt level: O0

SPlayTree<int> * __thiscall BinTrees::SPlayTree<int>::i<int_const&>(SPlayTree<int> *this,int *v)

{
  BinTree<int> *this_00;
  BinTree<int> **ppBVar1;
  runtime_error *prVar2;
  BinTree<int> *pBVar3;
  SPlayTree<int> *pSVar4;
  long extraout_RAX;
  SPlayTree<int> *this_01;
  BinTree<int> *extraout_RAX_00;
  BinTree<int> *extraout_RAX_01;
  long extraout_RAX_02;
  int iVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  SPlayTree<int> *in_RSI;
  SPlayTree<int> *in_RDI;
  char *in_R8;
  int in_R9D;
  SPlayTree<int> *i;
  SPlayTree<int> *root;
  BinTree<int> **ip;
  BinTree<int> *xp;
  BinTree<int> **in_stack_ffffffffffffff28;
  SPlayTree<int> *in_stack_ffffffffffffff30;
  BinSTree<int> *in_stack_ffffffffffffff38;
  SPlayTree<int> *in_stack_ffffffffffffff78;
  BinSTree<int> *in_stack_ffffffffffffff80;
  SPlayTree<int> *local_28;
  
  ppBVar1 = BinSTree<int>::unsafe_search
                      (in_stack_ffffffffffffff38,(int *)in_stack_ffffffffffffff30,
                       in_stack_ffffffffffffff28);
  if (*ppBVar1 != (BinTree<int> *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Repeated insert.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pBVar3 = (BinTree<int> *)operator_new(0x20);
  SPlayTree<int_const&>
            (in_stack_ffffffffffffff30,(int *)in_stack_ffffffffffffff28,(BinTree<int> *)0x1050b5);
  *ppBVar1 = pBVar3;
  this_00 = *ppBVar1;
  local_28 = in_RDI;
LAB_0010510a:
  do {
    while( true ) {
      ppBVar1 = BinTree<int>::P(this_00);
      if (*ppBVar1 == (BinTree<int> *)0x0) {
        return local_28;
      }
      ppBVar1 = BinTree<int>::P(this_00);
      ppBVar1 = BinTree<int>::P(*ppBVar1);
      if (*ppBVar1 != (BinTree<int> *)0x0) break;
      p((SPlayTree<int> *)0x10515a);
      pBVar3 = (BinTree<int> *)l((SPlayTree<int> *)0x105162);
      if (this_00 == pBVar3) {
        in_RSI = p((SPlayTree<int> *)0x105189);
        local_28 = (SPlayTree<int> *)
                   BinSTree<int>::RR(in_stack_ffffffffffffff80,
                                     &in_stack_ffffffffffffff78->super_BinSTree<int>);
      }
      else {
        in_RSI = p((SPlayTree<int> *)0x1051ba);
        local_28 = (SPlayTree<int> *)
                   BinSTree<int>::LR(in_stack_ffffffffffffff80,
                                     &in_stack_ffffffffffffff78->super_BinSTree<int>);
      }
    }
    p((SPlayTree<int> *)0x1051e1);
    p((SPlayTree<int> *)0x1051e9);
    pSVar4 = l((SPlayTree<int> *)0x1051f1);
    if (pSVar4 != (SPlayTree<int> *)0x0) {
      p((SPlayTree<int> *)0x105215);
      p((SPlayTree<int> *)0x10521d);
      l((SPlayTree<int> *)0x105225);
      pBVar3 = (BinTree<int> *)l((SPlayTree<int> *)0x10522d);
      if (this_00 == pBVar3) {
        p((SPlayTree<int> *)0x105254);
        p((SPlayTree<int> *)0x10525c);
        in_stack_ffffffffffffff80 =
             BinSTree<int>::RR(in_stack_ffffffffffffff80,&local_28->super_BinSTree<int>);
        in_RSI = p((SPlayTree<int> *)0x10528b);
        pSVar4 = (SPlayTree<int> *)
                 BinSTree<int>::RR(in_stack_ffffffffffffff80,&local_28->super_BinSTree<int>);
        in_stack_ffffffffffffff78 = local_28;
        local_28 = pSVar4;
        goto LAB_0010510a;
      }
    }
    p((SPlayTree<int> *)0x1052b2);
    pSVar4 = p((SPlayTree<int> *)0x1052ba);
    r(pSVar4,in_RSI,extraout_RDX,(int)pBVar3,in_R8,in_R9D,(int)in_stack_ffffffffffffff28);
    iVar5 = (int)pBVar3;
    if (extraout_RAX != 0) {
      p((SPlayTree<int> *)0x1052e6);
      pSVar4 = p((SPlayTree<int> *)0x1052ee);
      r(pSVar4,in_RSI,extraout_RDX_00,iVar5,in_R8,in_R9D,(int)in_stack_ffffffffffffff28);
      r(this_01,in_RSI,extraout_RDX_01,iVar5,in_R8,in_R9D,(int)in_stack_ffffffffffffff28);
      pBVar3 = extraout_RAX_00;
      if (this_00 == extraout_RAX_00) {
        p((SPlayTree<int> *)0x105325);
        p((SPlayTree<int> *)0x10532d);
        BinSTree<int>::LR(in_stack_ffffffffffffff80,&in_stack_ffffffffffffff78->super_BinSTree<int>)
        ;
        in_RSI = p((SPlayTree<int> *)0x10535c);
        local_28 = (SPlayTree<int> *)
                   BinSTree<int>::LR(in_stack_ffffffffffffff80,
                                     &in_stack_ffffffffffffff78->super_BinSTree<int>);
        goto LAB_0010510a;
      }
    }
    p((SPlayTree<int> *)0x105383);
    p((SPlayTree<int> *)0x10538b);
    pSVar4 = l((SPlayTree<int> *)0x105393);
    iVar5 = (int)pBVar3;
    if (pSVar4 != (SPlayTree<int> *)0x0) {
      p((SPlayTree<int> *)0x1053b7);
      p((SPlayTree<int> *)0x1053bf);
      pSVar4 = l((SPlayTree<int> *)0x1053c7);
      r(pSVar4,in_RSI,extraout_RDX_02,iVar5,in_R8,in_R9D,(int)in_stack_ffffffffffffff28);
      pBVar3 = extraout_RAX_01;
      if (this_00 == extraout_RAX_01) {
        p((SPlayTree<int> *)0x1053f6);
        BinSTree<int>::LR(in_stack_ffffffffffffff80,&in_stack_ffffffffffffff78->super_BinSTree<int>)
        ;
        in_RSI = p((SPlayTree<int> *)0x105425);
        local_28 = (SPlayTree<int> *)
                   BinSTree<int>::RR(in_stack_ffffffffffffff80,
                                     &in_stack_ffffffffffffff78->super_BinSTree<int>);
        goto LAB_0010510a;
      }
    }
    iVar5 = (int)pBVar3;
    p((SPlayTree<int> *)0x10544c);
    pSVar4 = p((SPlayTree<int> *)0x105454);
    r(pSVar4,in_RSI,extraout_RDX_03,iVar5,in_R8,in_R9D,(int)in_stack_ffffffffffffff28);
    if (extraout_RAX_02 == 0) {
LAB_00105505:
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"whoops!");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    p((SPlayTree<int> *)0x105480);
    pSVar4 = p((SPlayTree<int> *)0x105488);
    r(pSVar4,in_RSI,extraout_RDX_04,iVar5,in_R8,in_R9D,(int)in_stack_ffffffffffffff28);
    pBVar3 = (BinTree<int> *)l((SPlayTree<int> *)0x105498);
    if (this_00 != pBVar3) goto LAB_00105505;
    p((SPlayTree<int> *)0x1054bf);
    BinSTree<int>::RR(in_stack_ffffffffffffff80,&in_stack_ffffffffffffff78->super_BinSTree<int>);
    in_RSI = p((SPlayTree<int> *)0x1054ee);
    local_28 = (SPlayTree<int> *)
               BinSTree<int>::LR(in_stack_ffffffffffffff80,
                                 &in_stack_ffffffffffffff78->super_BinSTree<int>);
  } while( true );
}

Assistant:

SPlayTree<T> *SPlayTree<T>::i(F &&v) {
        BinTree<T> *xp = nullptr;
        BinTree<T> *&ip = this->unsafe_search(v, xp);
        auto root = this;
        if (ip) throw std::runtime_error("Repeated insert.");
        else {
            ip = new SPlayTree(std::forward<F>(v), xp);
        }
        auto i = static_cast<SPlayTree<T> *>(ip);
        while (i->P()) {
            if (i->P()->P() == nullptr) {
                if (i == i->p()->l())
                    root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p())));
                else
                    root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p())));
            } else if (i->p()->p()->l() && i == i->p()->p()->l()->l()) {
                root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p()->p())));
                root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p())));
            } else if (i->p()->p()->r() && i == i->p()->p()->r()->r()) {
                root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p()->p())));
                root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p())));
            } else if (i->p()->p()->l() && i == i->p()->p()->l()->r()) {
                root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p())));
                root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p())));
            } else if (i->p()->p()->r() && i == i->p()->p()->r()->l()) {
                root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p())));
                root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p())));
            } else throw std::runtime_error("whoops!");
        }

        return root;
    }